

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::stopListening(FileServer *this)

{
  pointer pIVar1;
  mutex_type *in_RDI;
  bool bVar2;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar3;
  byte local_1;
  
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x134b57);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
             ,in_RDI);
  pIVar1 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134b74);
  bVar2 = (pIVar1->isListening & 1U) != 0;
  if (bVar2) {
    pIVar1 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134b99);
    pIVar1->isListening = false;
  }
  else {
    local_1 = 0;
  }
  uVar3 = (uint)!bVar2;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x134baf);
  if (uVar3 == 0) {
    local_1 = 1;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool FileServer::stopListening() {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        if (m_impl->isListening == false) {
            return false;
        }

        m_impl->isListening = false;
    }

    return true;
}